

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O0

int xar_options(archive_write *a,char *key,char *value)

{
  int iVar1;
  undefined4 uVar2;
  int *piVar3;
  ulong uVar4;
  char *local_40;
  char *endptr;
  char *name;
  xar_conflict *xar;
  char *value_local;
  char *key_local;
  archive_write *a_local;
  
  name = (char *)a->format_data;
  xar = (xar_conflict *)value;
  value_local = key;
  key_local = (char *)a;
  iVar1 = strcmp(key,"checksum");
  if (iVar1 == 0) {
    if (xar == (xar_conflict *)0x0) {
      name[0x84] = '\0';
      name[0x85] = '\0';
      name[0x86] = '\0';
      name[0x87] = '\0';
    }
    else {
      iVar1 = strcmp((char *)xar,"none");
      if (iVar1 == 0) {
        name[0x84] = '\0';
        name[0x85] = '\0';
        name[0x86] = '\0';
        name[0x87] = '\0';
      }
      else {
        iVar1 = strcmp((char *)xar,"sha1");
        if (iVar1 == 0) {
          name[0x84] = '\x01';
          name[0x85] = '\0';
          name[0x86] = '\0';
          name[0x87] = '\0';
        }
        else {
          iVar1 = strcmp((char *)xar,"md5");
          if (iVar1 != 0) {
            archive_set_error((archive *)key_local,-1,"Unknown checksum name: `%s\'",xar);
            return -0x19;
          }
          name[0x84] = '\x02';
          name[0x85] = '\0';
          name[0x86] = '\0';
          name[0x87] = '\0';
        }
      }
    }
    a_local._4_4_ = 0;
  }
  else {
    iVar1 = strcmp(value_local,"compression");
    if (iVar1 == 0) {
      endptr = (char *)0x0;
      if (xar == (xar_conflict *)0x0) {
        name[0x88] = '\0';
        name[0x89] = '\0';
        name[0x8a] = '\0';
        name[0x8b] = '\0';
      }
      else {
        iVar1 = strcmp((char *)xar,"none");
        if (iVar1 == 0) {
          name[0x88] = '\0';
          name[0x89] = '\0';
          name[0x8a] = '\0';
          name[0x8b] = '\0';
        }
        else {
          iVar1 = strcmp((char *)xar,"gzip");
          if (iVar1 == 0) {
            name[0x88] = '\x01';
            name[0x89] = '\0';
            name[0x8a] = '\0';
            name[0x8b] = '\0';
          }
          else {
            iVar1 = strcmp((char *)xar,"bzip2");
            if (iVar1 == 0) {
              endptr = "bzip2";
            }
            else {
              iVar1 = strcmp((char *)xar,"lzma");
              if (iVar1 == 0) {
                name[0x88] = '\x03';
                name[0x89] = '\0';
                name[0x8a] = '\0';
                name[0x8b] = '\0';
              }
              else {
                iVar1 = strcmp((char *)xar,"xz");
                if (iVar1 != 0) {
                  archive_set_error((archive *)key_local,-1,"Unknown compression name: `%s\'",xar);
                  return -0x19;
                }
                name[0x88] = '\x04';
                name[0x89] = '\0';
                name[0x8a] = '\0';
                name[0x8b] = '\0';
              }
            }
          }
        }
      }
      if (endptr == (char *)0x0) {
        a_local._4_4_ = 0;
      }
      else {
        archive_set_error((archive *)key_local,-1,"`%s\' compression not supported on this platform"
                          ,endptr);
        a_local._4_4_ = -0x19;
      }
    }
    else {
      iVar1 = strcmp(value_local,"compression-level");
      if (iVar1 == 0) {
        if ((((xar == (xar_conflict *)0x0) || ((char)xar->temp_fd < '0')) ||
            ('9' < (char)xar->temp_fd)) || (*(char *)((long)&xar->temp_fd + 1) != '\0')) {
          archive_set_error((archive *)key_local,-1,"Illegal value `%s\'",xar);
          a_local._4_4_ = -0x19;
        }
        else {
          *(int *)(name + 0x8c) = (char)xar->temp_fd + -0x30;
          a_local._4_4_ = 0;
        }
      }
      else {
        iVar1 = strcmp(value_local,"toc-checksum");
        if (iVar1 == 0) {
          if (xar == (xar_conflict *)0x0) {
            name[0x80] = '\0';
            name[0x81] = '\0';
            name[0x82] = '\0';
            name[0x83] = '\0';
          }
          else {
            iVar1 = strcmp((char *)xar,"none");
            if (iVar1 == 0) {
              name[0x80] = '\0';
              name[0x81] = '\0';
              name[0x82] = '\0';
              name[0x83] = '\0';
            }
            else {
              iVar1 = strcmp((char *)xar,"sha1");
              if (iVar1 == 0) {
                name[0x80] = '\x01';
                name[0x81] = '\0';
                name[0x82] = '\0';
                name[0x83] = '\0';
              }
              else {
                iVar1 = strcmp((char *)xar,"md5");
                if (iVar1 != 0) {
                  archive_set_error((archive *)key_local,-1,"Unknown checksum name: `%s\'",xar);
                  return -0x19;
                }
                name[0x80] = '\x02';
                name[0x81] = '\0';
                name[0x82] = '\0';
                name[0x83] = '\0';
              }
            }
          }
          a_local._4_4_ = 0;
        }
        else {
          iVar1 = strcmp(value_local,"threads");
          if (iVar1 == 0) {
            if (xar == (xar_conflict *)0x0) {
              return -0x19;
            }
            piVar3 = __errno_location();
            *piVar3 = 0;
            uVar4 = strtoul((char *)xar,&local_40,10);
            *(int *)(name + 0x90) = (int)uVar4;
            piVar3 = __errno_location();
            if ((*piVar3 != 0) || (*local_40 != '\0')) {
              name[0x90] = '\x01';
              name[0x91] = '\0';
              name[0x92] = '\0';
              name[0x93] = '\0';
              archive_set_error((archive *)key_local,-1,"Illegal value `%s\'",xar);
              return -0x19;
            }
            if (*(int *)(name + 0x90) == 0) {
              uVar2 = lzma_cputhreads();
              *(undefined4 *)(name + 0x90) = uVar2;
            }
          }
          a_local._4_4_ = -0x14;
        }
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
xar_options(struct archive_write *a, const char *key, const char *value)
{
	struct xar *xar;

	xar = (struct xar *)a->format_data;

	if (strcmp(key, "checksum") == 0) {
		if (value == NULL)
			xar->opt_sumalg = CKSUM_NONE;
		else if (strcmp(value, "none") == 0)
			xar->opt_sumalg = CKSUM_NONE;
		else if (strcmp(value, "sha1") == 0)
			xar->opt_sumalg = CKSUM_SHA1;
		else if (strcmp(value, "md5") == 0)
			xar->opt_sumalg = CKSUM_MD5;
		else {
			archive_set_error(&(a->archive),
			    ARCHIVE_ERRNO_MISC,
			    "Unknown checksum name: `%s'",
			    value);
			return (ARCHIVE_FAILED);
		}
		return (ARCHIVE_OK);
	}
	if (strcmp(key, "compression") == 0) {
		const char *name = NULL;

		if (value == NULL)
			xar->opt_compression = NONE;
		else if (strcmp(value, "none") == 0)
			xar->opt_compression = NONE;
		else if (strcmp(value, "gzip") == 0)
			xar->opt_compression = GZIP;
		else if (strcmp(value, "bzip2") == 0)
#if defined(HAVE_BZLIB_H) && defined(BZ_CONFIG_ERROR)
			xar->opt_compression = BZIP2;
#else
			name = "bzip2";
#endif
		else if (strcmp(value, "lzma") == 0)
#if HAVE_LZMA_H
			xar->opt_compression = LZMA;
#else
			name = "lzma";
#endif
		else if (strcmp(value, "xz") == 0)
#if HAVE_LZMA_H
			xar->opt_compression = XZ;
#else
			name = "xz";
#endif
		else {
			archive_set_error(&(a->archive),
			    ARCHIVE_ERRNO_MISC,
			    "Unknown compression name: `%s'",
			    value);
			return (ARCHIVE_FAILED);
		}
		if (name != NULL) {
			archive_set_error(&(a->archive),
			    ARCHIVE_ERRNO_MISC,
			    "`%s' compression not supported "
			    "on this platform",
			    name);
			return (ARCHIVE_FAILED);
		}
		return (ARCHIVE_OK);
	}
	if (strcmp(key, "compression-level") == 0) {
		if (value == NULL ||
		    !(value[0] >= '0' && value[0] <= '9') ||
		    value[1] != '\0') {
			archive_set_error(&(a->archive),
			    ARCHIVE_ERRNO_MISC,
			    "Illegal value `%s'",
			    value);
			return (ARCHIVE_FAILED);
		}
		xar->opt_compression_level = value[0] - '0';
		return (ARCHIVE_OK);
	}
	if (strcmp(key, "toc-checksum") == 0) {
		if (value == NULL)
			xar->opt_toc_sumalg = CKSUM_NONE;
		else if (strcmp(value, "none") == 0)
			xar->opt_toc_sumalg = CKSUM_NONE;
		else if (strcmp(value, "sha1") == 0)
			xar->opt_toc_sumalg = CKSUM_SHA1;
		else if (strcmp(value, "md5") == 0)
			xar->opt_toc_sumalg = CKSUM_MD5;
		else {
			archive_set_error(&(a->archive),
			    ARCHIVE_ERRNO_MISC,
			    "Unknown checksum name: `%s'",
			    value);
			return (ARCHIVE_FAILED);
		}
		return (ARCHIVE_OK);
	}
	if (strcmp(key, "threads") == 0) {
		char *endptr;

		if (value == NULL)
			return (ARCHIVE_FAILED);
		errno = 0;
		xar->opt_threads = (int)strtoul(value, &endptr, 10);
		if (errno != 0 || *endptr != '\0') {
			xar->opt_threads = 1;
			archive_set_error(&(a->archive),
			    ARCHIVE_ERRNO_MISC,
			    "Illegal value `%s'",
			    value);
			return (ARCHIVE_FAILED);
		}
		if (xar->opt_threads == 0) {
#ifdef HAVE_LZMA_STREAM_ENCODER_MT
			xar->opt_threads = lzma_cputhreads();
#else
			xar->opt_threads = 1;
#endif
		}
	}

	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);
}